

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

Datetime * __thiscall Datetime::monthName_abi_cxx11_(Datetime *this,int month)

{
  int month_local;
  
  if (month < 1) {
    __assert_fail("month > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GothenburgBitFactory[P]flod/src/libshared/src/Datetime.cpp"
                  ,0xd6a,"static std::string Datetime::monthName(int)");
  }
  if (month < 0xd) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&monthNames_abi_cxx11_,(long)(month + -1));
    upperCaseFirst((string *)this);
    return this;
  }
  __assert_fail("month <= 12",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GothenburgBitFactory[P]flod/src/libshared/src/Datetime.cpp"
                ,0xd6b,"static std::string Datetime::monthName(int)");
}

Assistant:

std::string Datetime::monthName (int month)
{
  assert (month > 0);
  assert (month <= 12);
  return upperCaseFirst (monthNames[month - 1]);
}